

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::predicted_have_piece
          (torrent *this,piece_index_t index,time_duration duration)

{
  peer_connection *this_00;
  bool bVar1;
  uint uVar2;
  reference this_01;
  vector<peer_connection_*> *this_02;
  reference pppVar3;
  ulong uVar4;
  bool local_81;
  const_iterator local_78;
  int local_6c;
  rep local_68;
  peer_connection *local_60;
  peer_connection *p;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_38;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_30;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_28;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  i;
  torrent *this_local;
  time_duration duration_local;
  piece_index_t index_local;
  
  i._M_current = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)this;
  duration_local.__r._4_4_ = index.m_val;
  local_30._M_current =
       (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
       ::std::
       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ::begin(&this->m_predictive_pieces);
  local_38 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
             ::std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ::end(&this->m_predictive_pieces);
  local_28 = ::std::
             lower_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                       (local_30,(__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                  )local_38,
                        (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                        ((long)&duration_local.__r + 4));
  __range2 = (vector<peer_connection_*> *)
             ::std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ::end(&this->m_predictive_pieces);
  bVar1 = __gnu_cxx::operator!=
                    (&local_28,
                     (__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                      *)&__range2);
  local_81 = false;
  if (bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
              ::operator*(&local_28);
    local_81 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                         (this_01,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                  ((long)&duration_local.__r + 4));
  }
  if (local_81 == false) {
    this_02 = &(this->super_torrent_hot_members).m_connections;
    __end2 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&this_02->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
    p = (peer_connection *)
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::end(&this_02->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                       *)&p), bVar1) {
      pppVar3 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end2);
      this_00 = *pppVar3;
      local_60 = this_00;
      uVar2 = strong_typedef::operator_cast_to_int
                        ((strong_typedef *)((long)&duration_local.__r + 4));
      local_68 = duration.__r;
      uVar4 = total_milliseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_>)duration.__r);
      peer_connection::peer_log
                (this_00,outgoing,"PREDICTIVE_HAVE","piece: %d expected in %d ms",(ulong)uVar2,
                 uVar4 & 0xffffffff);
      local_6c = duration_local.__r._4_4_;
      peer_connection::announce_piece(local_60,duration_local.__r._4_4_);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
    ::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
              ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                *)&local_78,&local_28);
    ::std::
    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::insert(&this->m_predictive_pieces,local_78,(value_type *)((long)&duration_local.__r + 4));
  }
  return;
}

Assistant:

void torrent::predicted_have_piece(piece_index_t const index, time_duration const duration)
	{
		auto const i = std::lower_bound(m_predictive_pieces.begin()
			, m_predictive_pieces.end(), index);
		if (i != m_predictive_pieces.end() && *i == index) return;

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
#ifndef TORRENT_DISABLE_LOGGING
			p->peer_log(peer_log_alert::outgoing, "PREDICTIVE_HAVE", "piece: %d expected in %d ms"
				, static_cast<int>(index), static_cast<int>(total_milliseconds(duration)));
#else
			TORRENT_UNUSED(duration);
#endif
			p->announce_piece(index);
		}

		m_predictive_pieces.insert(i, index);
	}